

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O1

tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
 __thiscall
libtorrent::aux::file_piece_range_exclusive(aux *this,file_storage *fs,file_index_t file)

{
  pointer pfVar1;
  int iVar2;
  piece_index_t pVar3;
  piece_index_t pVar4;
  peer_request pVar5;
  
  pVar5 = file_storage::map_file(fs,file,0,1);
  pfVar1 = (fs->m_files).
           super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
           super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVar3 = pVar5.piece.m_val;
  if ((int)((ulong)((long)(fs->m_files).
                          super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                          .
                          super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1) >> 3) *
      -0x33333333 + -1 == file.m_val) {
    iVar2 = fs->m_num_pieces;
  }
  else {
    iVar2 = (int)((long)((*(ulong *)&pfVar1[file.m_val].field_0x8 & 0xffffffffffff) +
                         ((long)pVar5._0_8_ >> 0x20) + (long)pVar3.m_val * (long)fs->m_piece_length
                        + 1) / (long)fs->m_piece_length);
  }
  pVar4.m_val = pVar3.m_val + 1;
  if (pVar5._0_8_ >> 0x20 == 0) {
    pVar4.m_val = pVar3.m_val;
  }
  *(int *)this = iVar2;
  *(int *)(this + 4) = pVar4.m_val;
  return (tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          )(_Tuple_impl<0UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            )this;
}

Assistant:

std::tuple<piece_index_t, piece_index_t>
	file_piece_range_exclusive(file_storage const& fs, file_index_t const file)
	{
		peer_request const range = fs.map_file(file, 0, 1);
		std::int64_t const file_size = fs.file_size(file);
		std::int64_t const piece_size = fs.piece_length();
		piece_index_t const begin_piece = range.start == 0 ? range.piece : piece_index_t(static_cast<int>(range.piece) + 1);
		// the last piece is potentially smaller than the other pieces, so the
		// generic logic doesn't really work. If this file is the last file, the
		// last piece doesn't overlap with any other file and it's entirely
		// contained within the last file.
		piece_index_t const end_piece = (file == file_index_t(fs.num_files() - 1))
			? piece_index_t(fs.num_pieces())
			: piece_index_t(int((static_cast<int>(range.piece) * piece_size + range.start + file_size + 1) / piece_size));
		return std::make_tuple(begin_piece, end_piece);
	}